

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue_basic_tests.cpp
# Opt level: O0

void density_tests::
     dynamic_push_3<density_tests::PolymorphicBase,density::heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>>>
               (heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
                *i_queue)

{
  undefined1 local_68 [8];
  PolymorphicBase move_source;
  undefined1 local_38 [8];
  PolymorphicBase copy_source;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  type;
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  *i_queue_local;
  
  copy_source._24_8_ =
       density::
       runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
       ::make<density_tests::PolymorphicBase>();
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push(i_queue,(runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                      *)&copy_source.field_0x18);
  PolymorphicBase::PolymorphicBase((PolymorphicBase *)local_38);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_copy(i_queue,(runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                           *)&copy_source.field_0x18,(PolymorphicBase *)local_38);
  PolymorphicBase::PolymorphicBase((PolymorphicBase *)local_68);
  density::
  heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>_>
  ::dyn_push_move(i_queue,(runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
                           *)&copy_source.field_0x18,(PolymorphicBase *)local_68);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_68);
  PolymorphicBase::~PolymorphicBase((PolymorphicBase *)local_38);
  return;
}

Assistant:

void dynamic_push_3(QUEUE & i_queue)
    {
        auto const type = QUEUE::runtime_type::template make<ELEMENT>();

        i_queue.dyn_push(type);

        ELEMENT copy_source;
        i_queue.dyn_push_copy(type, &copy_source);

        ELEMENT move_source;
        i_queue.dyn_push_move(type, &move_source);
    }